

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void __thiscall am_loc_values::am_loc_values(am_loc_values *this)

{
  am_loc_values *this_local;
  
  Am_Inter_Location::Am_Inter_Location(&this->orig_value);
  this->left_control = 10;
  this->top_control = 10;
  this->width_control = 10;
  this->height_control = 10;
  this->left_equals = 0;
  this->left_offset = 0;
  this->left_object_offset = 0;
  this->left_centered = 0x32;
  this->top_equals = 0;
  this->top_offset = 0;
  this->top_object_offset = 0;
  this->top_centered = 0x32;
  this->width_equals = 0;
  this->width_offset = 0;
  this->width_object_offset = 0;
  this->width_object_percent = 100;
  this->height_equals = 0;
  this->height_offset = 0;
  this->height_object_offset = 0;
  this->height_object_percent = 100;
  this->growing = true;
  return;
}

Assistant:

am_loc_values::am_loc_values()
{
  left_control = am_change_equals;
  top_control = am_change_equals;
  width_control = am_change_equals;
  height_control = am_change_equals;

  left_equals = 0;
  left_offset = 0;
  left_object_offset = 0;
  left_centered = 50;
  top_equals = 0;
  top_offset = 0;
  top_object_offset = 0;
  top_centered = 50;
  width_equals = 0;
  width_offset = 0;
  width_object_offset = 0;
  width_object_percent = 100;
  height_equals = 0;
  height_offset = 0;
  height_object_offset = 0;
  height_object_percent = 100;

  growing = true;
}